

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::Seal
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance)

{
  byte bVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  DictionaryTypeHandlerBase<int> *pDVar5;
  undefined8 extraout_RDX;
  
  bVar1 = (this->super_DynamicTypeHandler).flags;
  if ((bVar1 & 0x40) != 0) {
    return 1;
  }
  if ((bVar1 & 4) == 0) {
    bVar2 = DynamicObject::HasObjectArray(instance);
    if (!bVar2) {
      BVar4 = SealInternal(this,instance);
      return BVar4;
    }
  }
  pDVar5 = ConvertToDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar5->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x37];
  iVar3 = (*UNRECOVERED_JUMPTABLE)(pDVar5,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Seal(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if (this->GetFlags() & IsSealedOnceFlag)
            {
                // Already sealed => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked() && !instance->HasObjectArray())
            {
                // If there is object array, we need to convert both type handler and array to ES5.
                // Otherwise, if the type is not shared with others, we can just change it by itself.
                return this->SealInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->Seal(instance);
    }